

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.c
# Opt level: O3

int get_signed_attribute(stack_st_X509_ATTRIBUTE *attribs,int nid,int type,char **buffer)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  void *__src;
  char *pcVar5;
  FILE *pFVar6;
  ASN1_OBJECT *a;
  ASN1_TYPE *pAVar7;
  X509_CRL *x;
  FILE *pFVar8;
  X509 *pXVar9;
  X509_NAME *pXVar10;
  char *pcVar11;
  X509_NAME *b;
  FILE *pFVar12;
  ASN1_INTEGER *x_00;
  FILE *fp;
  BIO *bp;
  PKCS7 *pPVar13;
  X509_EXTENSION *pXVar14;
  ulong uVar15;
  ulong uVar16;
  FILE *extraout_RDX;
  undefined8 uVar17;
  X509_ATTRIBUTE *buf;
  X509_ATTRIBUTE *pXVar18;
  X509_ATTRIBUTE *unaff_R12;
  int *piVar19;
  long lVar20;
  X509 *pXVar21;
  char **__size;
  ulong uVar22;
  char **unaff_R15;
  ASN1_TYPE *asn1_type;
  uint uStack_1d7c;
  PKCS7 *pPStack_1d78;
  BIO *pBStack_1d70;
  long lStack_1d68;
  byte abStack_1d60 [64];
  char acStack_1d20 [1024];
  char acStack_1920 [1032];
  FILE *pFStack_1518;
  int *piStack_1510;
  X509 *pXStack_1508;
  FILE *pFStack_1500;
  char **ppcStack_14f8;
  X509_ATTRIBUTE *pXStack_14f0;
  int aiStack_14e8 [258];
  FILE *pFStack_10e0;
  int *piStack_10d8;
  X509 *pXStack_10d0;
  X509_CRL *pXStack_10c8;
  FILE *pFStack_10c0;
  X509_ATTRIBUTE *pXStack_10b8;
  X509_ATTRIBUTE aXStack_10b0 [42];
  X509_ATTRIBUTE aXStack_cb0 [42];
  char acStack_8b0 [2056];
  FILE *pFStack_a8;
  X509_ATTRIBUTE *pXStack_a0;
  X509_CRL *local_30;
  
  pcVar11 = (char *)(ulong)(uint)nid;
  iVar2 = get_attribute(attribs,nid,(ASN1_TYPE **)&local_30);
  if (iVar2 != 0) {
    if (v_flag == 0) {
      return 1;
    }
    get_signed_attribute_cold_1();
    return 1;
  }
  __size = (char **)local_30;
  iVar2 = ASN1_TYPE_get((ASN1_TYPE *)local_30);
  if (iVar2 == type) {
    uVar3 = ASN1_STRING_length((ASN1_STRING *)local_30->sig_alg);
    if ((int)uVar3 < 1) {
      return 1;
    }
    unaff_R15 = (char **)(ulong)uVar3;
    if (d_flag != 0) {
      pcVar11 = pname;
      printf("%s: allocating %d bytes for attribute\n",pname,unaff_R15);
    }
    __size = (char **)(ulong)((type == 0x13) + uVar3);
    pcVar4 = (char *)malloc((size_t)__size);
    *buffer = pcVar4;
    if (pcVar4 != (char *)0x0) {
      __src = (void *)ASN1_STRING_get0_data(local_30->sig_alg);
      memcpy(pcVar4,__src,(size_t)unaff_R15);
      if (type != 0x13) {
        return 0;
      }
      (*buffer)[(long)unaff_R15] = '\0';
      return 0;
    }
  }
  else {
    get_signed_attribute_cold_2();
  }
  get_signed_attribute_cold_3();
  pcVar4 = pname;
  buf = (X509_ATTRIBUTE *)((ulong)pcVar11 & 0xffffffff);
  if (d_flag != 0) {
    pcVar5 = OBJ_nid2sn((int)pcVar11);
    printf("%s: finding attribute %s\n",pcVar4,pcVar5);
    unaff_R15 = (char **)pcVar4;
  }
  *(long *)extraout_RDX = 0;
  pXVar18 = buf;
  pFVar6 = (FILE *)OBJ_nid2obj((int)pcVar11);
  if (pFVar6 != (FILE *)0x0) {
    iVar2 = OPENSSL_sk_num(__size);
    if (0 < iVar2) {
      buf = (X509_ATTRIBUTE *)0x0;
      do {
        unaff_R12 = (X509_ATTRIBUTE *)OPENSSL_sk_value(__size,buf);
        a = X509_ATTRIBUTE_get0_object(unaff_R12);
        iVar2 = OBJ_cmp(a,(ASN1_OBJECT *)pFVar6);
        if ((iVar2 == 0) &&
           (pXVar18 = unaff_R12, iVar2 = X509_ATTRIBUTE_count(unaff_R12), iVar2 != 0)) {
          if (*(long *)extraout_RDX != 0) {
            get_attribute_cold_1();
            unaff_R15 = (char **)pFVar6;
            goto LAB_0010d8de;
          }
          pAVar7 = X509_ATTRIBUTE_get0_type(unaff_R12,0);
          *(ASN1_TYPE **)extraout_RDX = pAVar7;
        }
        uVar3 = (int)buf + 1;
        buf = (X509_ATTRIBUTE *)(ulong)uVar3;
        iVar2 = OPENSSL_sk_num(__size);
      } while ((int)uVar3 < iVar2);
    }
    return (int)(*(long *)extraout_RDX == 0);
  }
LAB_0010d8de:
  get_attribute_cold_2();
  pFVar6 = *(FILE **)(*(long *)(pXVar18[7].value.ptr + 0x20) + 0x18);
  x = (X509_CRL *)OPENSSL_sk_value(pFVar6,0);
  if (x == (X509_CRL *)0x0) {
    write_crl_cold_3();
LAB_0010d9ac:
    write_crl_cold_2();
    pFVar8 = extraout_RDX;
  }
  else {
    unaff_R15 = &w_char;
    pFVar6 = (FILE *)w_char;
    pFVar8 = fopen(w_char,"w");
    __size = (char **)x;
    if (pFVar8 == (FILE *)0x0) goto LAB_0010d9ac;
    if (v_flag != 0) {
      printf("%s: writing CRL\n",pname);
    }
    if (d_flag != 0) {
      PEM_write_X509_CRL(_stdout,x);
    }
    pFVar6 = pFVar8;
    iVar2 = PEM_write_X509_CRL(pFVar8,x);
    if (iVar2 == 1) {
      printf("%s: CRL written as %s\n",pname,w_char);
      iVar2 = fclose(pFVar8);
      return iVar2;
    }
  }
  write_crl_cold_1();
  localcert = (X509 *)0x0;
  pFVar6 = *(FILE **)(*(long *)(pFVar6->__pad5 + 0x20) + 0x10);
  pFStack_a8 = pFVar8;
  pXStack_a0 = unaff_R12;
  if (v_flag != 0) {
    pXStack_10b8 = (X509_ATTRIBUTE *)0x10d9f7;
    uVar3 = OPENSSL_sk_num(pFVar6);
    pXStack_10b8 = (X509_ATTRIBUTE *)0x10da07;
    printf("write_local_cert(): found %d cert(s)\n",(ulong)uVar3);
  }
  pXStack_10b8 = (X509_ATTRIBUTE *)0x10da0f;
  pFVar8 = pFVar6;
  iVar2 = OPENSSL_sk_num();
  pXVar9 = (X509 *)localcert;
  if (0 < iVar2) {
    __size = (char **)0x0;
    do {
      pXStack_10b8 = (X509_ATTRIBUTE *)0x10da25;
      pXVar9 = (X509 *)OPENSSL_sk_value(pFVar6,__size);
      pcVar11 = pname;
      if (v_flag != 0) {
        pXStack_10b8 = (X509_ATTRIBUTE *)0x10da45;
        pXVar10 = X509_get_subject_name(pXVar9);
        pXStack_10b8 = (X509_ATTRIBUTE *)0x10da58;
        pcVar4 = X509_NAME_oneline(pXVar10,(char *)aXStack_10b0,0x400);
        pXStack_10b8 = (X509_ATTRIBUTE *)0x10da6c;
        printf("%s: found certificate with\n  subject: \'%s\'\n",pcVar11,pcVar4);
        pXStack_10b8 = (X509_ATTRIBUTE *)0x10da74;
        pXVar10 = X509_get_issuer_name(pXVar9);
        pXStack_10b8 = (X509_ATTRIBUTE *)0x10da84;
        pcVar11 = X509_NAME_oneline(pXVar10,(char *)aXStack_10b0,0x400);
        pXStack_10b8 = (X509_ATTRIBUTE *)0x10da95;
        printf("  issuer: %s\n",pcVar11);
        pXStack_10b8 = (X509_ATTRIBUTE *)0x10daa1;
        pXVar10 = (X509_NAME *)X509_REQ_get_subject_name(request);
        pXStack_10b8 = (X509_ATTRIBUTE *)0x10dab1;
        pcVar11 = X509_NAME_oneline(pXVar10,(char *)aXStack_10b0,0x400);
        pXStack_10b8 = (X509_ATTRIBUTE *)0x10dac2;
        printf("  request_subject: \'%s\'\n",pcVar11);
        buf = aXStack_10b0;
      }
      pXStack_10b8 = (X509_ATTRIBUTE *)0x10daca;
      pXVar10 = X509_get_subject_name(pXVar9);
      pXStack_10b8 = (X509_ATTRIBUTE *)0x10dad9;
      b = (X509_NAME *)X509_REQ_get_subject_name(request);
      pXStack_10b8 = (X509_ATTRIBUTE *)0x10dae4;
      iVar2 = X509_NAME_cmp(pXVar10,b);
      if (d_flag != 0) {
        pXStack_10b8 = (X509_ATTRIBUTE *)0x10dbc5;
        write_local_cert_cold_1();
      }
      if (iVar2 == 0) {
LAB_0010db6a:
        if (v_flag != 0) {
          pXStack_10b8 = (X509_ATTRIBUTE *)0x10db7d;
          puts("CN\'s of request and certificate matched!");
        }
      }
      else {
        pXStack_10b8 = (X509_ATTRIBUTE *)0x10db04;
        pXVar10 = X509_get_subject_name(pXVar9);
        pXStack_10b8 = (X509_ATTRIBUTE *)0x10db1c;
        X509_NAME_oneline(pXVar10,acStack_8b0,0x400);
        pXStack_10b8 = (X509_ATTRIBUTE *)0x10db28;
        pXVar10 = (X509_NAME *)X509_REQ_get_subject_name(request);
        buf = aXStack_cb0;
        pXStack_10b8 = (X509_ATTRIBUTE *)0x10db40;
        X509_NAME_oneline(pXVar10,(char *)buf,0x400);
        if (v_flag != 0) {
          pXStack_10b8 = (X509_ATTRIBUTE *)0x10db5b;
          printf(" X509_NAME_cmp() workaround: strcmp request subject (%s) to cert subject (%s)\n",
                 buf,acStack_8b0);
        }
        pXStack_10b8 = (X509_ATTRIBUTE *)0x10db66;
        iVar2 = strcmp(acStack_8b0,(char *)buf);
        if (iVar2 == 0) goto LAB_0010db6a;
        pXStack_10b8 = (X509_ATTRIBUTE *)0x10dbcf;
        write_local_cert_cold_2();
      }
      pXStack_10b8 = (X509_ATTRIBUTE *)0x10db85;
      unaff_R15 = (char **)X509_get_subject_name(pXVar9);
      pXStack_10b8 = (X509_ATTRIBUTE *)0x10db90;
      pXVar10 = X509_get_issuer_name(pXVar9);
      pXStack_10b8 = (X509_ATTRIBUTE *)0x10db9b;
      pFVar8 = (FILE *)unaff_R15;
      iVar2 = X509_NAME_cmp((X509_NAME *)unaff_R15,pXVar10);
      if (iVar2 != 0) break;
      uVar3 = (int)__size + 1;
      __size = (char **)(ulong)uVar3;
      pXStack_10b8 = (X509_ATTRIBUTE *)0x10dbaa;
      pFVar8 = pFVar6;
      iVar2 = OPENSSL_sk_num();
      pXVar9 = (X509 *)localcert;
    } while ((int)uVar3 < iVar2);
  }
  localcert = (X509 *)pXVar9;
  pXVar21 = localcert;
  if (localcert == (X509 *)0x0) {
    pXStack_10b8 = (X509_ATTRIBUTE *)0x10dc7f;
    write_local_cert_cold_5();
  }
  else {
    __size = &l_char;
    pXStack_10b8 = (X509_ATTRIBUTE *)0x10dc00;
    pFVar8 = (FILE *)l_char;
    pFVar12 = fopen(l_char,"w");
    if (pFVar12 != (FILE *)0x0) {
      if (v_flag != 0) {
        pXStack_10b8 = (X509_ATTRIBUTE *)0x10dc2a;
        printf("%s: certificate written as %s\n",pname,l_char);
      }
      if (d_flag != 0) {
        pXStack_10b8 = (X509_ATTRIBUTE *)0x10dc4c;
        PEM_write_X509(_stdout,(X509 *)localcert);
      }
      pXStack_10b8 = (X509_ATTRIBUTE *)0x10dc5b;
      pFVar8 = pFVar12;
      iVar2 = PEM_write_X509(pFVar12,(X509 *)localcert);
      pFVar6 = pFVar12;
      if (iVar2 == 1) {
        pXStack_10b8 = (X509_ATTRIBUTE *)0x10dc68;
        iVar2 = fclose(pFVar12);
        return iVar2;
      }
      goto LAB_0010dc84;
    }
  }
  pXStack_10b8 = (X509_ATTRIBUTE *)0x10dc84;
  write_local_cert_cold_4();
LAB_0010dc84:
  pXStack_10b8 = (X509_ATTRIBUTE *)write_other_cert;
  write_local_cert_cold_3();
  piStack_10d8 = &v_flag;
  uVar17 = *(undefined8 *)(*(long *)(pFVar8->__pad5 + 0x20) + 0x10);
  pXStack_14f0 = (X509_ATTRIBUTE *)0x10dcb4;
  pFStack_10e0 = pFVar6;
  pXStack_10d0 = pXVar21;
  pXStack_10c8 = (X509_CRL *)__size;
  pFStack_10c0 = (FILE *)unaff_R15;
  pXStack_10b8 = buf;
  iVar2 = OPENSSL_sk_num(uVar17);
  piVar19 = &v_flag;
  if (0 < iVar2) {
    pXVar21 = (X509 *)0x0;
    do {
      pXStack_14f0 = (X509_ATTRIBUTE *)0x10dccd;
      pFVar6 = (FILE *)OPENSSL_sk_value(uVar17,pXVar21);
      pcVar11 = pname;
      if (v_flag != 0) {
        pXStack_14f0 = (X509_ATTRIBUTE *)0x10dcee;
        pXVar10 = X509_get_subject_name((X509 *)pFVar6);
        pXStack_14f0 = (X509_ATTRIBUTE *)0x10dcfe;
        pcVar4 = X509_NAME_oneline(pXVar10,(char *)aiStack_14e8,0x400);
        pXStack_14f0 = (X509_ATTRIBUTE *)0x10dd12;
        printf("%s: found certificate with\n  subject: %s\n",pcVar11,pcVar4);
        pXStack_14f0 = (X509_ATTRIBUTE *)0x10dd1a;
        pXVar10 = X509_get_issuer_name((X509 *)pFVar6);
        pXStack_14f0 = (X509_ATTRIBUTE *)0x10dd2a;
        pcVar4 = X509_NAME_oneline(pXVar10,(char *)aiStack_14e8,0x400);
        pXStack_14f0 = (X509_ATTRIBUTE *)0x10dd3b;
        printf("  issuer: %s\n",pcVar4);
        buf = (X509_ATTRIBUTE *)pcVar11;
      }
      pXStack_14f0 = (X509_ATTRIBUTE *)0x10dd43;
      x_00 = X509_get_serialNumber((X509 *)pFVar6);
      pXStack_14f0 = (X509_ATTRIBUTE *)0x10dd56;
      iVar2 = ASN1_INTEGER_cmp(x_00,*(ASN1_INTEGER **)((long)pFVar8->__pad3 + 8));
      piVar19 = aiStack_14e8;
      if (iVar2 == 0) goto LAB_0010dd73;
      uVar3 = (int)pXVar21 + 1;
      pXVar21 = (X509 *)(ulong)uVar3;
      pXStack_14f0 = (X509_ATTRIBUTE *)0x10dd65;
      iVar2 = OPENSSL_sk_num(uVar17);
      piVar19 = aiStack_14e8;
    } while ((int)uVar3 < iVar2);
  }
  do {
    pXStack_14f0 = (X509_ATTRIBUTE *)0x10dd73;
    write_other_cert_cold_3();
LAB_0010dd73:
  } while (pFVar6 == (FILE *)0x0);
  pXStack_14f0 = (X509_ATTRIBUTE *)0x10dd8e;
  pFVar12 = (FILE *)w_char;
  fp = fopen(w_char,"w");
  if (fp == (FILE *)0x0) {
    pXStack_14f0 = (X509_ATTRIBUTE *)0x10de0a;
    write_other_cert_cold_2();
  }
  else {
    if (v_flag != 0) {
      pXStack_14f0 = (X509_ATTRIBUTE *)0x10ddbd;
      printf("%s: certificate written as %s\n",pname,w_char);
    }
    if (d_flag != 0) {
      pXStack_14f0 = (X509_ATTRIBUTE *)0x10dddb;
      PEM_write_X509(_stdout,(X509 *)pFVar6);
    }
    pXStack_14f0 = (X509_ATTRIBUTE *)0x10dde6;
    pFVar12 = fp;
    iVar2 = PEM_write_X509(fp,(X509 *)pFVar6);
    pFVar8 = fp;
    if (iVar2 == 1) {
      pXStack_14f0 = (X509_ATTRIBUTE *)0x10ddf3;
      iVar2 = fclose(fp);
      return iVar2;
    }
  }
  pXStack_14f0 = (X509_ATTRIBUTE *)write_ca_ra;
  write_other_cert_cold_1();
  ppcStack_14f8 = &w_char;
  pFStack_1518 = pFVar6;
  piStack_1510 = piVar19;
  pXStack_1508 = pXVar21;
  pFStack_1500 = pFVar8;
  pXStack_14f0 = buf;
  bp = BIO_new_mem_buf(pFVar12->_IO_read_end,*(int *)&pFVar12->_IO_read_base);
  pPVar13 = d2i_PKCS7_bio(bp,(PKCS7 **)0x0);
  if (pPVar13 == (PKCS7 *)0x0) {
    pcVar11 = "%s: error reading PKCS#7 data\n";
LAB_0010de5c:
    fprintf(_stderr,pcVar11,pname);
LAB_0010de66:
    ERR_print_errors_fp(_stderr);
  }
  else {
    iVar2 = OBJ_obj2nid(pPVar13->type);
    if (iVar2 == 0x16) {
      lVar20 = ((pPVar13->d).data)->flags;
      if (lVar20 != 0) {
        pPStack_1d78 = pPVar13;
        pBStack_1d70 = bp;
        iVar2 = OPENSSL_sk_num(lVar20);
        if (0 < iVar2) {
          uVar22 = 0;
          lStack_1d68 = lVar20;
          do {
            memset(acStack_1920,0,0x400);
            memset(acStack_1d20,0,0x400);
            pXVar9 = (X509 *)OPENSSL_sk_value(lVar20,uVar22);
            snprintf(acStack_1d20,0x400,"%s-%d",c_char,uVar22);
            pcVar11 = pname;
            if (v_flag != 0) {
              pXVar10 = X509_get_subject_name(pXVar9);
              pcVar4 = X509_NAME_oneline(pXVar10,acStack_1920,0x400);
              printf("\n%s: found certificate with\n  subject: %s\n",pcVar11,pcVar4);
              if (v_flag != 0) {
                pXVar10 = X509_get_issuer_name(pXVar9);
                pcVar11 = X509_NAME_oneline(pXVar10,acStack_1920,0x400);
                printf("  issuer: %s\n",pcVar11);
              }
            }
            iVar2 = X509_digest(pXVar9,(EVP_MD *)fp_alg,abStack_1d60,&uStack_1d7c);
            if (iVar2 == 0) goto LAB_0010de66;
            iVar2 = X509_get_ext_by_NID(pXVar9,0x57,-1);
            if (iVar2 < 0) {
              if (v_flag != 0) {
                puts("  basic constraints: (not included)");
              }
            }
            else {
              pXVar14 = X509_get_ext(pXVar9,iVar2);
              if (v_flag != 0) {
                printf("  basic constraints: ");
                X509V3_EXT_print_fp(_stdout,pXVar14,0,0);
                putchar(10);
              }
            }
            iVar2 = X509_get_ext_by_NID(pXVar9,0x53,-1);
            if (iVar2 < 0) {
              if (v_flag != 0) {
                puts("  usage: (not included)");
                goto LAB_0010e0d7;
              }
            }
            else {
              pXVar14 = X509_get_ext(pXVar9,iVar2);
              if (v_flag != 0) {
                printf("  usage: ");
                X509V3_EXT_print_fp(_stdout,pXVar14,0,0);
                putchar(10);
LAB_0010e0d7:
                if (v_flag != 0) {
                  iVar2 = EVP_MD_get_type(fp_alg);
                  pcVar11 = OBJ_nid2sn(iVar2);
                  printf("  %s fingerprint: ",pcVar11);
                  uVar16 = (ulong)uStack_1d7c;
                  if (0 < (int)uStack_1d7c) {
                    uVar15 = 0;
                    do {
                      uVar1 = uVar15 + 1;
                      uVar17 = 10;
                      if (uVar1 != (uVar16 & 0xffffffff)) {
                        uVar17 = 0x3a;
                      }
                      printf("%02X%c",(ulong)abStack_1d60[uVar15],uVar17);
                      uVar16 = (ulong)(int)uStack_1d7c;
                      uVar15 = uVar1;
                    } while ((long)uVar1 < (long)uVar16);
                  }
                }
              }
            }
            pFVar6 = fopen(acStack_1d20,"w");
            if (pFVar6 == (FILE *)0x0) {
              pcVar11 = "%s: cannot open cert file for writing\n";
              goto LAB_0010dea6;
            }
            if (v_flag != 0) {
              printf("%s: certificate written as %s\n",pname,acStack_1d20);
            }
            if (d_flag != 0) {
              PEM_write_X509(_stdout,pXVar9);
            }
            iVar2 = PEM_write_X509(pFVar6,pXVar9);
            if (iVar2 != 1) {
              pcVar11 = "%s: error while writing certificate file\n";
              goto LAB_0010de5c;
            }
            fclose(pFVar6);
            lVar20 = lStack_1d68;
            uVar3 = (int)uVar22 + 1;
            uVar22 = (ulong)uVar3;
            iVar2 = OPENSSL_sk_num(lStack_1d68);
          } while ((int)uVar3 < iVar2);
        }
        PKCS7_free(pPStack_1d78);
        BIO_free(pBStack_1d70);
        exit(0);
      }
      pcVar11 = "%s: cannot find certificates\n";
LAB_0010dea6:
      fprintf(_stderr,pcVar11,pname);
    }
    else {
      printf("%s: wrong PKCS#7 type\n",pname);
    }
  }
  exit(0x5d);
}

Assistant:

int get_signed_attribute(STACK_OF(X509_ATTRIBUTE) *attribs, int nid,int type, char **buffer){
	int		rc;
	ASN1_TYPE	*asn1_type;
	int		len;

	/* Find attribute */
	rc = get_attribute(attribs, nid, &asn1_type);
	if (rc == 1) {
		if (v_flag)
			fprintf(stderr, "%s: error finding attribute\n",pname);
		return (1);
	}
	if (ASN1_TYPE_get(asn1_type) != type) {
		fprintf(stderr, "%s: wrong ASN.1 type\n",pname);
		exit (SCEP_PKISTATUS_P7);
	}

	/* Copy data */
	len = ASN1_STRING_length(asn1_type->value.asn1_string);
	if (len <= 0) {
		return (1);
	} else if (d_flag)
		printf("%s: allocating %d bytes for attribute\n", pname, len);
	if (type == V_ASN1_PRINTABLESTRING) {
		*buffer = (char *)malloc(len + 1);
	} else {
		*buffer = (char *)malloc(len);
	}
	if (*buffer == NULL) {
		fprintf(stderr, "%s: cannot malloc space for attribute\n",
			pname);
		exit (SCEP_PKISTATUS_P7);
	}
/* for compatibility with older openssl versions
   from: https://wiki.openssl.org/index.php/OpenSSL_1.1.0_Changes

*/
#if OPENSSL_VERSION_NUMBER < 0x10100000L
	memcpy(*buffer, ASN1_STRING_data(asn1_type->value.asn1_string), len);
#else
	memcpy(*buffer, ASN1_STRING_get0_data(asn1_type->value.asn1_string), len);
#endif

	/* Add null terminator if it's a PrintableString */
	if (type == V_ASN1_PRINTABLESTRING) {
		(*buffer)[len] = 0;
		len++;
	}

	return (0);
}